

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_patchclose(FuncState *fs,int list,int level)

{
  uint uVar1;
  int local_14;
  int level_local;
  int list_local;
  FuncState *fs_local;
  
  uVar1 = level + 1;
  local_14 = list;
  while( true ) {
    if (local_14 == -1) {
      return;
    }
    if (((fs->f->code[local_14] & 0xff) != 0x1e) ||
       (((fs->f->code[local_14] >> 8 & 0x7f) != 0 &&
        ((int)(fs->f->code[local_14] >> 8 & 0x7f) < (int)uVar1)))) break;
    *(byte *)((long)fs->f->code + (long)local_14 * 4 + 1) = (byte)uVar1 & 0x7f;
    if ((ravi_parser_debug & 2U) != 0) {
      raviY_printf(fs,"[?]* %o ; set A to %d\n",(ulong)fs->f->code[local_14],(ulong)uVar1);
    }
    local_14 = getjump(fs,local_14);
  }
  __assert_fail("((OpCode)(((fs->f->code[list])&0xff))) == OP_JMP && (((int)(((fs->f->code[list])>>8)&0x7f)) == 0 || ((int)(((fs->f->code[list])>>8)&0x7f)) >= level)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                ,0x125,"void luaK_patchclose(FuncState *, int, int)");
}

Assistant:

void luaK_patchclose (FuncState *fs, int list, int level) {
  level++;  /* argument is +1 to reserve 0 as non-op */
  for (; list != NO_JUMP; list = getjump(fs, list)) {
    lua_assert(GET_OPCODE(fs->f->code[list]) == OP_JMP &&
                (GETARG_A(fs->f->code[list]) == 0 ||
                 GETARG_A(fs->f->code[list]) >= level));
    SETARG_A(fs->f->code[list], level);
    DEBUG_CODEGEN(raviY_printf(fs, "[?]* %o ; set A to %d\n", fs->f->code[list], level));
  }
}